

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6bc613::HKDFTest_TestVectors_Test::TestBody(HKDFTest_TestVectors_Test *this)

{
  uint8_t *info;
  size_t sVar1;
  AssertHelperData *out_len;
  int iVar2;
  EVP_MD *pEVar3;
  EVP_PKEY_CTX *pEVar4;
  _Head_base<0UL,_evp_pkey_ctx_st_*,_false> _Var5;
  pointer *__ptr_3;
  pointer *__ptr;
  AssertHelperData *pAVar6;
  ScopedTrace *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  AssertHelper *this_02;
  char *pcVar7;
  uint8_t *puVar8;
  pointer *__ptr_2;
  pointer *__ptr_1;
  long lVar9;
  long lVar10;
  ulong info_len;
  bool bVar11;
  internal iVar12;
  UniquePtr<EVP_PKEY_CTX> copy;
  ScopedTrace gtest_trace_335;
  ScopedTrace gtest_trace_289;
  ScopedTrace gtest_trace_257;
  UniquePtr<EVP_PKEY_CTX> ctx;
  size_t len;
  bool copy_ctx;
  size_t prk_len;
  uint8_t buf [82];
  uint8_t prk [64];
  undefined1 local_1b8 [8];
  AssertHelperData *local_1b0;
  _Head_base<0UL,_evp_pkey_ctx_st_*,_false> local_1a8;
  ScopedTrace local_19a;
  ScopedTrace local_199;
  undefined1 local_198 [8];
  AssertHelperData *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  Bytes local_178;
  ScopedTrace local_161;
  _Head_base<0UL,_evp_pkey_ctx_st_*,_false> local_160;
  AssertHelper local_158;
  undefined2 local_14a;
  AssertHelperData *local_148;
  AssertHelper local_140;
  AssertHelperData *local_138;
  size_t local_130;
  code *local_128;
  uint8_t *local_120;
  unsigned_long local_118;
  uint8_t *local_110;
  size_t local_108;
  uint8_t *local_100;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined2 local_98;
  size_t local_90;
  long local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  AssertHelperData *local_40;
  AssertHelperData *local_38;
  
  local_118 = 0;
  do {
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_190;
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&local_161,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x101,&local_118);
    lVar10 = local_118 * 0x1b8;
    local_128 = (code *)(&(anonymous_namespace)::kTests)[local_118 * 0x37];
    pEVar3 = (EVP_MD *)(*local_128)();
    local_100 = &UNK_006d98c8 + lVar10;
    local_108 = *(size_t *)(&DAT_006d9918 + lVar10);
    sVar1 = *(size_t *)(&DAT_006d9970 + lVar10);
    puVar8 = &UNK_006d9920 + lVar10;
    local_110 = puVar8;
    iVar2 = HKDF_extract((uint8_t *)&local_88,(size_t *)&local_148,pEVar3,local_100,local_108,puVar8
                         ,sVar1);
    local_198[0] = (internal)(iVar2 != 0);
    local_190 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)local_1b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e8,(internal *)local_198,
                 (AssertionResult *)
                 "HKDF_extract(prk, &prk_len, test->md_func(), test->ikm, test->ikm_len, test->salt, test->salt_len)"
                 ,"false","true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x107,(char *)local_e8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if (local_e8 != (undefined1  [8])&local_d8) {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
      }
      if (local_1b8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1b8 + 8))();
      }
      pAVar6 = local_190;
      if (local_190 == (AssertHelperData *)0x0) goto LAB_002f6b22;
LAB_002f6d5f:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pAVar6);
LAB_002f6b22:
      testing::ScopedTrace::~ScopedTrace(&local_161);
      return;
    }
    local_198 = (undefined1  [8])((long)&DAT_006d99d0 + lVar10);
    pAVar6 = *(AssertHelperData **)(&DAT_006d9a10 + lVar10);
    local_1b8 = (undefined1  [8])&local_88;
    local_1b0 = local_148;
    local_190 = pAVar6;
    local_f0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
    local_90 = sVar1;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_e8,"Bytes(test->prk, test->prk_len)","Bytes(prk, prk_len)",
               (Bytes *)local_198,(Bytes *)local_1b8);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_198);
      pcVar7 = "";
      if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = (pbStack_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x108,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
      if (local_198 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_198 + 8))();
      }
    }
    if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_e0,pbStack_e0);
    }
    out_len = *(AssertHelperData **)(&DAT_006d9a18 + lVar10);
    pEVar3 = (EVP_MD *)(*local_128)();
    puVar8 = &UNK_006d9978 + lVar10;
    local_130 = *(size_t *)(&DAT_006d99c8 + lVar10);
    local_120 = puVar8;
    iVar2 = HKDF_expand(local_e8,(size_t)out_len,pEVar3,(uint8_t *)&local_88,(size_t)local_148,
                        puVar8,local_130);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    local_138 = out_len;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)
                 "HKDF_expand(buf, test->out_len, test->md_func(), prk, prk_len, test->info, test->info_len)"
                 ,"false","true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_160,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x10c,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_178);
LAB_002f6d16:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
      if (local_198 != (undefined1  [8])&local_188) {
        operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
      }
      if ((long *)local_178.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_178.span_.data_ + 8))();
      }
      if (local_1b0 == (AssertHelperData *)0x0) goto LAB_002f6b22;
      this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_1b0;
      pAVar6 = local_1b0;
      goto LAB_002f6d5f;
    }
    local_1b8 = (undefined1  [8])((long)&DAT_006d9a20 + lVar10);
    local_178.span_.data_ = local_e8;
    local_1b0 = out_len;
    local_178.span_.size_ = (size_t)out_len;
    local_f8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_198,"Bytes(test->out, test->out_len)","Bytes(buf, test->out_len)",
               (Bytes *)local_1b8,&local_178);
    sVar1 = local_90;
    if (local_198[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1b8);
      pcVar7 = "";
      if (local_190 != (AssertHelperData *)0x0) {
        pcVar7 = *(char **)local_190;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x10d,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if (local_1b8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1b8 + 8))();
      }
    }
    if (local_190 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
    }
    pEVar3 = (EVP_MD *)(*local_128)();
    puVar8 = local_110;
    iVar2 = HKDF(local_e8,(size_t)local_138,pEVar3,local_100,local_108,local_110,sVar1,local_120,
                 local_130);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)
                 "HKDF(buf, test->out_len, test->md_func(), test->ikm, test->ikm_len, test->salt, test->salt_len, test->info, test->info_len)"
                 ,"false","true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_160,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x111,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_178);
      goto LAB_002f6d16;
    }
    local_1b8 = (undefined1  [8])local_f8._M_head_impl;
    local_1b0 = local_138;
    local_178.span_.data_ = local_e8;
    local_178.span_.size_ = (size_t)local_138;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_198,"Bytes(test->out, test->out_len)","Bytes(buf, test->out_len)",
               (Bytes *)local_1b8,&local_178);
    if (local_198[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1b8);
      pcVar7 = "";
      if (local_190 != (AssertHelperData *)0x0) {
        pcVar7 = *(char **)local_190;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x112,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if (local_1b8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1b8 + 8))();
      }
    }
    if (local_190 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
    }
    local_160._M_head_impl = (evp_pkey_ctx_st *)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
    local_1b8[0] = (internal)(local_160._M_head_impl != (EVP_PKEY_CTX *)0x0);
    local_1b0 = (AssertHelperData *)0x0;
    if (local_160._M_head_impl == (EVP_PKEY_CTX *)0x0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,(AssertionResult *)0x5203a5,"false",
                 "true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x117,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
LAB_002f7015:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
      if (local_198 != (undefined1  [8])&local_188) {
        operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
      }
      if ((long *)local_178.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_178.span_.data_ + 8))();
      }
joined_r0x002f7544:
      if (local_1b0 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0)
        ;
      }
LAB_002f6b18:
      std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_160);
      goto LAB_002f6b22;
    }
    iVar2 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)local_160._M_head_impl);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false","true",(char *)puVar8)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x118,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_CTX_hkdf_mode(local_160._M_head_impl,1);
    _Var5._M_head_impl = local_160._M_head_impl;
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 1)","false","true",
                 (char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x11a,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    pEVar3 = (EVP_MD *)(*local_128)();
    iVar2 = EVP_PKEY_CTX_set_hkdf_md(_Var5._M_head_impl,pEVar3);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())","false",
                 "true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x11b,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_CTX_set1_hkdf_key(local_160._M_head_impl,local_100,local_108);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)
                 "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len)","false","true",
                 (char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x11d,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_CTX_set1_hkdf_salt(local_160._M_head_impl,local_110,sVar1);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)
                 "EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len)","false","true"
                 ,(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x11f,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    local_140.data_._0_2_ = 0x100;
    local_38 = (AssertHelperData *)((long)&pAVar6[-1].message.field_2 + 0xf);
    local_40 = (AssertHelperData *)((long)&((_Alloc_hider *)&pAVar6->type)->_M_p + 1);
    lVar9 = 0;
    do {
      local_14a = CONCAT11(local_14a._1_1_,*(undefined1 *)((long)&local_140.data_ + lVar9));
      testing::ScopedTrace::ScopedTrace<bool>
                (&local_199,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x121,(bool *)&local_14a);
      local_1a8._M_head_impl = (EVP_PKEY_CTX *)0x0;
      _Var5._M_head_impl = local_160._M_head_impl;
      if (local_14a._0_1_ == true) {
        pEVar4 = (EVP_PKEY_CTX *)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)local_160._M_head_impl);
        _Var5._M_head_impl = local_1a8._M_head_impl;
        bVar11 = local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0;
        local_1a8._M_head_impl = pEVar4;
        if (bVar11) {
          EVP_PKEY_CTX_free((EVP_PKEY_CTX *)_Var5._M_head_impl);
        }
        local_1b8[0] = (internal)(local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0);
        local_1b0 = (AssertHelperData *)0x0;
        _Var5._M_head_impl = local_1a8._M_head_impl;
        if (local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0) goto LAB_002f5e36;
        testing::Message::Message((Message *)&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_198,(internal *)local_1b8,(AssertionResult *)0x53b636,"false",
                   "true",(char *)puVar8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x126,(char *)local_198);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_178);
LAB_002f6ab7:
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        if (local_198 != (undefined1  [8])&local_188) {
          operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
        }
        if ((long *)local_178.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_178.span_.data_ + 8))();
        }
        if (local_1b0 != (AssertHelperData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0);
        }
        std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_1a8);
        this_00 = &local_199;
        goto LAB_002f6b13;
      }
LAB_002f5e36:
      local_148 = (AssertHelperData *)0x0;
      iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,(uchar *)0x0,(size_t *)&local_148);
      local_1b8[0] = (internal)(iVar2 != 0);
      local_1b0 = (AssertHelperData *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_198,(internal *)local_1b8,
                   (AssertionResult *)"EVP_PKEY_derive(use_ctx, nullptr, &prk_len)","false","true",
                   (char *)puVar8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,300,(char *)local_198);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_178);
        goto LAB_002f6ab7;
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_198,"prk_len","test->prk_len",(unsigned_long *)&local_148,
                 (unsigned_long *)(&DAT_006d9a10 + lVar10));
      if (local_198[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1b8);
        pcVar7 = "";
        if (local_190 != (AssertHelperData *)0x0) {
          pcVar7 = *(char **)local_190;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x12d,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
        if (local_1b8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_1b8 + 8))();
        }
      }
      if (local_190 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
        ;
      }
      local_148 = local_38;
      iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,(uchar *)&local_88,
                              (size_t *)&local_148);
      iVar12 = (internal)(iVar2 == 0);
      local_1b0 = (AssertHelperData *)0x0;
      local_1b8[0] = iVar12;
      if (!(bool)iVar12) {
        testing::Message::Message((Message *)&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_198,(internal *)local_1b8,
                   (AssertionResult *)"EVP_PKEY_derive(use_ctx, prk, &prk_len)","true","false",
                   (char *)puVar8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x131,(char *)local_198);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_178);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        if (local_198 != (undefined1  [8])&local_188) {
          operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
        }
        if ((long *)local_178.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_178.span_.data_ + 8))();
        }
        if (local_1b0 != (AssertHelperData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0);
        }
      }
      ERR_clear_error();
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_148 = pAVar6;
      iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,(uchar *)&local_88,
                              (size_t *)&local_148);
      local_1b8[0] = (internal)(iVar2 != 0);
      local_1b0 = (AssertHelperData *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_198,(internal *)local_1b8,
                   (AssertionResult *)"EVP_PKEY_derive(use_ctx, prk, &prk_len)","false","true",
                   (char *)puVar8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x137,(char *)local_198);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_178);
        goto LAB_002f6ab7;
      }
      local_1b8 = (undefined1  [8])local_f0._M_head_impl;
      local_178.span_.data_ = (uchar *)&local_88;
      local_178.span_.size_ = (size_t)local_148;
      local_1b0 = pAVar6;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_198,"Bytes(test->prk, test->prk_len)","Bytes(prk, prk_len)",
                 (Bytes *)local_1b8,&local_178);
      if (local_198[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1b8);
        pcVar7 = "";
        if (local_190 != (AssertHelperData *)0x0) {
          pcVar7 = *(char **)local_190;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x138,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
        if (local_1b8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_1b8 + 8))();
        }
      }
      if (local_190 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
        ;
      }
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_148 = local_40;
      iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,(uchar *)&local_88,
                              (size_t *)&local_148);
      local_1b8[0] = (internal)(iVar2 != 0);
      local_1b0 = (AssertHelperData *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_198,(internal *)local_1b8,
                   (AssertionResult *)"EVP_PKEY_derive(use_ctx, prk, &prk_len)","false","true",
                   (char *)puVar8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x13d,(char *)local_198);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_178);
        goto LAB_002f6ab7;
      }
      local_1b8 = (undefined1  [8])local_f0._M_head_impl;
      local_178.span_.data_ = (uchar *)&local_88;
      local_178.span_.size_ = (size_t)local_148;
      local_1b0 = pAVar6;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_198,"Bytes(test->prk, test->prk_len)","Bytes(prk, prk_len)",
                 (Bytes *)local_1b8,&local_178);
      if (local_198[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1b8);
        pcVar7 = "";
        if (local_190 != (AssertHelperData *)0x0) {
          pcVar7 = *(char **)local_190;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x13e,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
        if (local_1b8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_1b8 + 8))();
        }
      }
      if (local_190 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
        ;
      }
      std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_1a8);
      testing::ScopedTrace::~ScopedTrace(&local_199);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 2);
    pEVar4 = (EVP_PKEY_CTX *)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
    _Var5._M_head_impl = local_160._M_head_impl;
    bVar11 = local_160._M_head_impl != (EVP_PKEY_CTX *)0x0;
    local_160._M_head_impl = pEVar4;
    if (bVar11) {
      EVP_PKEY_CTX_free((EVP_PKEY_CTX *)_Var5._M_head_impl);
    }
    local_1b8[0] = (internal)(local_160._M_head_impl != (EVP_PKEY_CTX *)0x0);
    local_1b0 = (AssertHelperData *)0x0;
    if (local_160._M_head_impl == (EVP_PKEY_CTX *)0x0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,(AssertionResult *)0x5203a5,"false",
                 "true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x142,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)local_160._M_head_impl);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false","true",(char *)puVar8)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x143,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_CTX_hkdf_mode(local_160._M_head_impl,2);
    _Var5._M_head_impl = local_160._M_head_impl;
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 2)","false","true",
                 (char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x145,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    pEVar3 = (EVP_MD *)(*local_128)();
    iVar2 = EVP_PKEY_CTX_set_hkdf_md(_Var5._M_head_impl,pEVar3);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())","false",
                 "true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x146,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_CTX_set1_hkdf_key
                      (local_160._M_head_impl,(uint8_t *)local_f0._M_head_impl,(size_t)pAVar6);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)
                 "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->prk, test->prk_len)","false","true",
                 (char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x148,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    info_len = local_130 >> 1;
    iVar2 = EVP_PKEY_CTX_add1_hkdf_info(local_160._M_head_impl,local_120,info_len);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half)",
                 "false","true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x14b,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    info = local_120 + info_len;
    local_130 = local_130 - info_len;
    iVar2 = EVP_PKEY_CTX_add1_hkdf_info(local_160._M_head_impl,info,local_130);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)
                 "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half, test->info_len - half)",
                 "false","true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x14d,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    local_14a = 0x100;
    lVar10 = 0;
    do {
      local_199 = *(ScopedTrace *)((long)&local_14a + lVar10);
      testing::ScopedTrace::ScopedTrace<bool>
                (&local_19a,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x14f,(bool *)&local_199);
      local_1a8._M_head_impl = (EVP_PKEY_CTX *)0x0;
      _Var5._M_head_impl = local_160._M_head_impl;
      if (local_199 == (ScopedTrace)0x1) {
        pEVar4 = (EVP_PKEY_CTX *)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)local_160._M_head_impl);
        _Var5._M_head_impl = local_1a8._M_head_impl;
        bVar11 = local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0;
        local_1a8._M_head_impl = pEVar4;
        if (bVar11) {
          EVP_PKEY_CTX_free((EVP_PKEY_CTX *)_Var5._M_head_impl);
        }
        local_1b8[0] = (internal)(local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0);
        local_1b0 = (AssertHelperData *)0x0;
        _Var5._M_head_impl = local_1a8._M_head_impl;
        if (local_1a8._M_head_impl == (EVP_PKEY_CTX *)0x0) {
          testing::Message::Message((Message *)&local_178);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_198,(internal *)local_1b8,(AssertionResult *)0x53b636,"false",
                     "true",(char *)puVar8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_158,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x154,(char *)local_198);
          testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_178);
          goto LAB_002f7138;
        }
      }
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8._M_allocated_capacity = 0;
      local_d8._8_8_ = 0;
      local_e8 = (undefined1  [8])0x0;
      pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_98 = 0;
      local_158.data_ = local_138;
      iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,local_e8,(size_t *)&local_158);
      local_1b8[0] = (internal)(iVar2 != 0);
      local_1b0 = (AssertHelperData *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_198,(internal *)local_1b8,
                   (AssertionResult *)"EVP_PKEY_derive(use_ctx, buf, &len)","false","true",
                   (char *)puVar8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x159,(char *)local_198);
        testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_178);
        goto LAB_002f70cb;
      }
      local_1b8 = (undefined1  [8])local_f8._M_head_impl;
      local_1b0 = local_138;
      local_178.span_.data_ = local_e8;
      local_178.span_.size_ = (size_t)local_158.data_;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_198,"Bytes(test->out, test->out_len)","Bytes(buf, len)",
                 (Bytes *)local_1b8,&local_178);
      if (local_198[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1b8);
        pcVar7 = "";
        if (local_190 != (AssertHelperData *)0x0) {
          pcVar7 = *(char **)local_190;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x15a,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
        if (local_1b8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_1b8 + 8))();
        }
      }
      if (local_190 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
        ;
      }
      std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_1a8);
      testing::ScopedTrace::~ScopedTrace(&local_19a);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 2);
    pEVar4 = (EVP_PKEY_CTX *)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
    pAVar6 = local_138;
    _Var5._M_head_impl = local_160._M_head_impl;
    bVar11 = local_160._M_head_impl != (EVP_PKEY_CTX *)0x0;
    local_160._M_head_impl = pEVar4;
    if (bVar11) {
      EVP_PKEY_CTX_free((EVP_PKEY_CTX *)_Var5._M_head_impl);
    }
    local_1b8[0] = (internal)(local_160._M_head_impl != (EVP_PKEY_CTX *)0x0);
    local_1b0 = (AssertHelperData *)0x0;
    if (local_160._M_head_impl == (EVP_PKEY_CTX *)0x0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,(AssertionResult *)0x5203a5,"false",
                 "true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x15e,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)local_160._M_head_impl);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false","true",(char *)puVar8)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x15f,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
      if (local_198 != (undefined1  [8])&local_188) {
        operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
      }
      if ((long *)local_178.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_178.span_.data_ + 8))();
      }
      goto joined_r0x002f7544;
    }
    iVar2 = EVP_PKEY_CTX_hkdf_mode(local_160._M_head_impl,0);
    _Var5._M_head_impl = local_160._M_head_impl;
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 0)","false","true",
                 (char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x161,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
      if (local_198 != (undefined1  [8])&local_188) {
        operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
      }
      if ((long *)local_178.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_178.span_.data_ + 8))();
      }
      goto joined_r0x002f7544;
    }
    pEVar3 = (EVP_MD *)(*local_128)();
    iVar2 = EVP_PKEY_CTX_set_hkdf_md(_Var5._M_head_impl,pEVar3);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())","false",
                 "true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x162,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_CTX_set1_hkdf_key(local_160._M_head_impl,local_100,local_108);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)
                 "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len)","false","true",
                 (char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x164,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_CTX_set1_hkdf_salt(local_160._M_head_impl,local_110,local_90);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)
                 "EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len)","false","true"
                 ,(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x166,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_CTX_add1_hkdf_info(local_160._M_head_impl,local_120,info_len);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)"EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half)",
                 "false","true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x168,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    iVar2 = EVP_PKEY_CTX_add1_hkdf_info(local_160._M_head_impl,info,local_130);
    local_1b8[0] = (internal)(iVar2 != 0);
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_1b8,
                 (AssertionResult *)
                 "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half, test->info_len - half)",
                 "false","true",(char *)puVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x16a,(char *)local_198);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_178);
      goto LAB_002f7015;
    }
    local_14a = 0x100;
    lVar10 = 0;
    do {
      local_199 = *(ScopedTrace *)((long)&local_14a + lVar10);
      testing::ScopedTrace::ScopedTrace<bool>
                (&local_19a,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x16c,(bool *)&local_199);
      local_1a8._M_head_impl = (EVP_PKEY_CTX *)0x0;
      _Var5._M_head_impl = local_160._M_head_impl;
      if (local_199 == (ScopedTrace)0x1) {
        pEVar4 = (EVP_PKEY_CTX *)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)local_160._M_head_impl);
        _Var5._M_head_impl = local_1a8._M_head_impl;
        bVar11 = local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0;
        local_1a8._M_head_impl = pEVar4;
        if (bVar11) {
          EVP_PKEY_CTX_free((EVP_PKEY_CTX *)_Var5._M_head_impl);
        }
        local_1b8[0] = (internal)(local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0);
        local_1b0 = (AssertHelperData *)0x0;
        _Var5._M_head_impl = local_1a8._M_head_impl;
        if (local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0) goto LAB_002f6786;
        testing::Message::Message((Message *)&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_198,(internal *)local_1b8,(AssertionResult *)0x53b636,"false",
                   "true",(char *)puVar8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x171,(char *)local_198);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_178);
LAB_002f7138:
        this_02 = &local_158;
LAB_002f7140:
        testing::internal::AssertHelper::~AssertHelper(this_02);
        if (local_198 != (undefined1  [8])&local_188) {
          operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
        }
        if ((long *)local_178.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_178.span_.data_ + 8))();
        }
        if (local_1b0 != (AssertHelperData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0);
        }
        std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_1a8);
        this_00 = &local_19a;
LAB_002f6b13:
        testing::ScopedTrace::~ScopedTrace(this_00);
        goto LAB_002f6b18;
      }
LAB_002f6786:
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8._M_allocated_capacity = 0;
      local_d8._8_8_ = 0;
      local_e8 = (undefined1  [8])0x0;
      pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_98 = 0;
      local_158.data_ = pAVar6;
      iVar2 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,local_e8,(size_t *)&local_158);
      local_1b8[0] = (internal)(iVar2 != 0);
      local_1b0 = (AssertHelperData *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_198,(internal *)local_1b8,
                   (AssertionResult *)"EVP_PKEY_derive(use_ctx, buf, &len)","false","true",
                   (char *)puVar8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x176,(char *)local_198);
        testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_178);
LAB_002f70cb:
        this_02 = &local_140;
        goto LAB_002f7140;
      }
      local_1b8 = (undefined1  [8])local_f8._M_head_impl;
      local_1b0 = pAVar6;
      local_178.span_.data_ = local_e8;
      local_178.span_.size_ = (size_t)local_158.data_;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_198,"Bytes(test->out, test->out_len)","Bytes(buf, len)",
                 (Bytes *)local_1b8,&local_178);
      if (local_198[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1b8);
        pcVar7 = "";
        if (local_190 != (AssertHelperData *)0x0) {
          pcVar7 = *(char **)local_190;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x177,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
        if (local_1b8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_1b8 + 8))();
        }
      }
      if (local_190 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
        ;
      }
      std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_1a8);
      testing::ScopedTrace::~ScopedTrace(&local_19a);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 2);
    std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_160);
    testing::ScopedTrace::~ScopedTrace(&local_161);
    local_118 = local_118 + 1;
    if (6 < local_118) {
      return;
    }
  } while( true );
}

Assistant:

TEST(HKDFTest, TestVectors) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTests); i++) {
    SCOPED_TRACE(i);
    const HKDFTestVector *test = &kTests[i];

    uint8_t prk[EVP_MAX_MD_SIZE];
    size_t prk_len;
    ASSERT_TRUE(HKDF_extract(prk, &prk_len, test->md_func(), test->ikm,
                             test->ikm_len, test->salt, test->salt_len));
    EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));

    uint8_t buf[82];
    ASSERT_TRUE(HKDF_expand(buf, test->out_len, test->md_func(), prk, prk_len,
                            test->info, test->info_len));
    EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, test->out_len));

    ASSERT_TRUE(HKDF(buf, test->out_len, test->md_func(), test->ikm,
                     test->ikm_len, test->salt, test->salt_len, test->info,
                     test->info_len));
    EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, test->out_len));

    // Repeat the test with the OpenSSL compatibility |EVP_PKEY_derive| API.
    bssl::UniquePtr<EVP_PKEY_CTX> ctx(
        EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_hkdf_mode(ctx.get(), EVP_PKEY_HKDEF_MODE_EXTRACT_ONLY));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }

      // A null output should report the length.
      prk_len = 0;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, nullptr, &prk_len));
      EXPECT_EQ(prk_len, test->prk_len);

      // Too small of a buffer should cleanly fail.
      prk_len = test->prk_len - 1;
      EXPECT_FALSE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      ERR_clear_error();

      // Test the correct buffer size.
      OPENSSL_memset(prk, 0, sizeof(prk));
      prk_len = test->prk_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));

      // Test a larger buffer than necessary.
      OPENSSL_memset(prk, 0, sizeof(prk));
      prk_len = test->prk_len + 1;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));
    }

    ctx.reset(EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_hkdf_mode(ctx.get(), EVP_PKEY_HKDEF_MODE_EXPAND_ONLY));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->prk, test->prk_len));
    // |info| can be passed in multiple parts.
    size_t half = test->info_len / 2;
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half));
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half,
                                            test->info_len - half));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }
      OPENSSL_memset(buf, 0, sizeof(buf));
      size_t len = test->out_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, buf, &len));
      EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, len));
    }

    ctx.reset(EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(EVP_PKEY_CTX_hkdf_mode(ctx.get(),
                                       EVP_PKEY_HKDEF_MODE_EXTRACT_AND_EXPAND));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len));
    // |info| can be passed in multiple parts.
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half));
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half,
                                            test->info_len - half));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }
      OPENSSL_memset(buf, 0, sizeof(buf));
      size_t len = test->out_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, buf, &len));
      EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, len));
    }
  }
}